

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * QString::trimmed_helper(QString *__return_storage_ptr__,QString *str)

{
  QChar *pQVar1;
  long lVar2;
  Data *pDVar3;
  QChar *unicode;
  TrimPositions TVar4;
  
  TVar4 = QStringAlgorithms<const_QString>::trimmed_helper_positions(str);
  unicode = TVar4.begin;
  pQVar1 = (QChar *)(str->d).ptr;
  if ((unicode == pQVar1) && (lVar2 = (str->d).size, TVar4.end == pQVar1 + lVar2)) {
    pDVar3 = (str->d).d;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = (char16_t *)pQVar1;
    (__return_storage_ptr__->d).size = lVar2;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    QString(__return_storage_ptr__,unicode,(long)TVar4.end - (long)unicode >> 1);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::trimmed_helper(const QString &str)
{
    return QStringAlgorithms<const QString>::trimmed_helper(str);
}